

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O0

void __thiscall
duckdb::LogicalOperatorVisitor::VisitOperatorExpressions
          (LogicalOperatorVisitor *this,LogicalOperator *op)

{
  function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
  *in_stack_000001f8;
  LogicalOperator *in_stack_00000200;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffb8;
  function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
  *in_stack_ffffffffffffffc0;
  
  ::std::
  function<void(duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>*)>
  ::
  function<duckdb::LogicalOperatorVisitor::VisitOperatorExpressions(duckdb::LogicalOperator&)::__0,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  EnumerateExpressions(in_stack_00000200,in_stack_000001f8);
  ::std::
  function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
  ::~function((function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
               *)0xe8670f);
  return;
}

Assistant:

void LogicalOperatorVisitor::VisitOperatorExpressions(LogicalOperator &op) {
	LogicalOperatorVisitor::EnumerateExpressions(op, [&](unique_ptr<Expression> *child) { VisitExpression(child); });
}